

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovDevice.cpp
# Opt level: O0

cl_int cov::getDeviceIDs(cl_platform_id platform,cl_device_type deviceType,cl_uint numEntries,
                        cl_device_id *devices,cl_uint *numDevices)

{
  bool bVar1;
  uint32_t uVar2;
  Platform *p;
  cl_uint *numDevices_local;
  cl_device_id *devices_local;
  cl_uint numEntries_local;
  cl_device_type deviceType_local;
  cl_platform_id platform_local;
  
  if (numDevices != (cl_uint *)0x0) {
    uVar2 = Platform::getNumDevices();
    *numDevices = uVar2;
  }
  if (devices == (cl_device_id *)0x0) {
    platform_local._4_4_ = 0;
  }
  else if (numEntries == 0) {
    platform_local._4_4_ = 0;
  }
  else {
    bVar1 = ClObject<cov::ObjectMagic,_(cov::ObjectMagic)2>::initSuccess
                      ((ClObject<cov::ObjectMagic,_(cov::ObjectMagic)2> *)g_device);
    if (bVar1) {
      *devices = (cl_device_id)g_device;
      platform_local._4_4_ = 0;
    }
    else {
      platform_local._4_4_ = -6;
    }
  }
  return platform_local._4_4_;
}

Assistant:

cl_int getDeviceIDs(cl_platform_id platform,
                    cl_device_type deviceType,
                    cl_uint numEntries,
                    cl_device_id* devices,
                    cl_uint* numDevices)
{
    auto p = reinterpret_cast<Platform*>(platform);
    if (numDevices) *numDevices = p->getNumDevices();
    if (!devices) return CL_SUCCESS;
    if (numEntries == 0) return CL_SUCCESS;

    if (!g_device.initSuccess()) return CL_OUT_OF_HOST_MEMORY;

    *devices = reinterpret_cast<_cl_device_id*>(&g_device);
    return CL_SUCCESS;
}